

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdDecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  ulong *puVar1;
  ulong *puVar2;
  word *pwVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint nWords;
  uint uVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  word *pwVar12;
  
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  bVar5 = (byte)v;
  if ((*pTruth & 1) == 0) {
    if (5 < v) {
      bVar4 = bVar5 - 6 & 0x1f;
      pwVar12 = pTruth;
      uVar7 = (ulong)(uint)(1 << bVar4);
      if (1 << bVar4 < 1) {
        uVar7 = 0;
      }
      for (; pwVar12 < pTruth + (int)nWords; pwVar12 = pwVar12 + (2 << (bVar5 - 6 & 0x1f))) {
        uVar9 = 0;
        while (uVar7 != uVar9) {
          pwVar10 = pwVar12 + uVar9;
          uVar9 = uVar9 + 1;
          if (*pwVar10 != 0) goto LAB_0043050e;
        }
      }
LAB_00430744:
      Dau_DsdWriteString(p,"(");
      Abc_TtCofactor1(pTruth,nWords,v);
      goto LAB_0043083f;
    }
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)nWords) {
      uVar9 = (ulong)nWords;
    }
    do {
      if (uVar9 == uVar7) goto LAB_00430744;
      puVar1 = pTruth + uVar7;
      uVar7 = uVar7 + 1;
    } while ((*puVar1 & s_Truths6Neg[v]) == 0);
LAB_0043050e:
    pwVar12 = pTruth + (int)nWords;
    if ((long)pwVar12[-1] < 0) {
      if (5 < v) {
        uVar8 = 1 << (bVar5 - 6 & 0x1f);
        iVar6 = 2 << (bVar5 - 6 & 0x1f);
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        pwVar10 = pTruth + (int)uVar8;
        for (pwVar11 = pTruth; pwVar11 < pwVar12; pwVar11 = pwVar11 + iVar6) {
          uVar9 = 0;
          while (uVar7 != uVar9) {
            pwVar3 = pwVar10 + uVar9;
            uVar9 = uVar9 + 1;
            if (*pwVar3 != 0xffffffffffffffff) goto LAB_00430588;
          }
          pwVar10 = pwVar10 + iVar6;
        }
LAB_0043080f:
        Dau_DsdWriteString(p,"!(!");
        Abc_TtCofactor0(pTruth,nWords,v);
        goto LAB_00430830;
      }
      uVar7 = 0;
      uVar9 = 0;
      if (0 < (int)nWords) {
        uVar9 = (ulong)nWords;
      }
      do {
        if (uVar9 == uVar7) goto LAB_0043080f;
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while ((s_Truths6[v] & ~*puVar1) == 0);
    }
    else {
      if (5 < v) {
        uVar8 = 1 << (bVar5 - 6 & 0x1f);
        iVar6 = 2 << (bVar5 - 6 & 0x1f);
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        pwVar10 = pTruth + (int)uVar8;
        for (pwVar11 = pTruth; pwVar11 < pwVar12; pwVar11 = pwVar11 + iVar6) {
          uVar9 = 0;
          while (uVar7 != uVar9) {
            pwVar3 = pwVar10 + uVar9;
            uVar9 = uVar9 + 1;
            if (*pwVar3 != 0) goto LAB_00430588;
          }
          pwVar10 = pwVar10 + iVar6;
        }
LAB_004307e3:
        Dau_DsdWriteString(p,"(!");
        Abc_TtCofactor0(pTruth,nWords,v);
        goto LAB_0043083f;
      }
      uVar7 = 0;
      uVar9 = 0;
      if (0 < (int)nWords) {
        uVar9 = (ulong)nWords;
      }
      do {
        if (uVar9 == uVar7) goto LAB_004307e3;
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while ((*puVar1 & s_Truths6[v]) == 0);
    }
LAB_00430588:
    if (v < 6) {
      uVar7 = 0;
      uVar9 = 0;
      if (0 < (int)nWords) {
        uVar9 = (ulong)nWords;
      }
      while (uVar9 != uVar7) {
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
        if ((s_Truths6[v] & ~(*puVar1 << ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ *puVar1)) != 0) {
          return 0;
        }
      }
    }
    else {
      uVar8 = 1 << (bVar5 - 6 & 0x1f);
      iVar6 = 2 << (bVar5 - 6 & 0x1f);
      uVar7 = 0;
      if (0 < (int)uVar8) {
        uVar7 = (ulong)uVar8;
      }
      pwVar10 = pTruth + (int)uVar8;
      for (pwVar11 = pTruth; pwVar11 < pwVar12; pwVar11 = pwVar11 + iVar6) {
        uVar9 = 0;
        while (uVar7 != uVar9) {
          puVar1 = pwVar10 + uVar9;
          puVar2 = pwVar11 + uVar9;
          uVar9 = uVar9 + 1;
          if ((*puVar1 ^ *puVar2) != 0xffffffffffffffff) {
            return 0;
          }
        }
        pwVar10 = pwVar10 + iVar6;
      }
    }
    Dau_DsdWriteString(p,"[");
    Abc_TtCofactor0(pTruth,nWords,v);
    p->uConstMask = p->uConstMask | 1 << ((byte)p->nConsts & 0x1f);
  }
  else {
    if (v < 6) {
      uVar7 = 0;
      uVar9 = 0;
      if (0 < (int)nWords) {
        uVar9 = (ulong)nWords;
      }
      do {
        if (uVar9 == uVar7) goto LAB_0043076c;
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while ((s_Truths6Neg[v] & ~*puVar1) == 0);
      goto LAB_0043050e;
    }
    bVar4 = bVar5 - 6 & 0x1f;
    pwVar12 = pTruth;
    uVar7 = (ulong)(uint)(1 << bVar4);
    if (1 << bVar4 < 1) {
      uVar7 = 0;
    }
    for (; pwVar12 < pTruth + (int)nWords; pwVar12 = pwVar12 + (2 << (bVar5 - 6 & 0x1f))) {
      uVar9 = 0;
      while (uVar7 != uVar9) {
        pwVar10 = pwVar12 + uVar9;
        uVar9 = uVar9 + 1;
        if (*pwVar10 != 0xffffffffffffffff) goto LAB_0043050e;
      }
    }
LAB_0043076c:
    Dau_DsdWriteString(p,"!(");
    Abc_TtCofactor1(pTruth,nWords,v);
LAB_00430830:
    Abc_TtNot(pTruth,nWords);
  }
LAB_0043083f:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[(long)nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_DsdDecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    int nWords = Abc_TtWordNum(nVars);
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_TtCof0IsConst1( pTruth, nWords, v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof0IsConst0( pTruth, nWords, v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[nWords-1] >> 63 )
    {        
        if ( Abc_TtCof1IsConst1( pTruth, nWords, v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof1IsConst0( pTruth, nWords, v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_TtCofsOpposite( pTruth, nWords, v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        Abc_TtCofactor0( pTruth, nWords, v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}